

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

size_t google::protobuf::internal::SerialArena::FreeStringBlocks
                 (StringBlock *string_block,size_t unused_bytes)

{
  StringBlock *pSVar1;
  string *psVar2;
  string *psVar3;
  size_t sVar4;
  size_t sVar5;
  StringBlock *__range3;
  StringBlock *this;
  string *s;
  LogMessageFatal LStack_38;
  
  if (string_block != (StringBlock *)0x0) {
    this = string_block->next_;
    psVar2 = StringBlock::end_abi_cxx11_(string_block);
    for (psVar3 = StringBlock::AtOffset_abi_cxx11_(string_block,unused_bytes); psVar3 != psVar2;
        psVar3 = psVar3 + 1) {
      std::__cxx11::string::~string((string *)psVar3);
    }
    sVar4 = StringBlock::Delete(string_block);
    while (this != (StringBlock *)0x0) {
      pSVar1 = this->next_;
      psVar2 = StringBlock::begin_abi_cxx11_(this);
      psVar3 = StringBlock::end_abi_cxx11_(this);
      for (; psVar2 != psVar3; psVar2 = psVar2 + 1) {
        std::__cxx11::string::~string((string *)psVar2);
      }
      sVar5 = StringBlock::Delete(this);
      sVar4 = sVar4 + sVar5;
      this = pSVar1;
    }
    return sVar4;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
             ,0x16a,"string_block != nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_38);
}

Assistant:

size_t SerialArena::FreeStringBlocks(StringBlock* string_block,
                                     size_t unused_bytes) {
  ABSL_DCHECK(string_block != nullptr);
  StringBlock* next = string_block->next();
  absl::PrefetchToLocalCacheNta(next);
  std::string* end = string_block->end();
  for (std::string* s = string_block->AtOffset(unused_bytes); s != end; ++s) {
    s->~basic_string();
  }
  size_t deallocated = StringBlock::Delete(string_block);

  while ((string_block = next) != nullptr) {
    next = string_block->next();
    absl::PrefetchToLocalCacheNta(next);
    for (std::string& s : *string_block) {
      s.~basic_string();
    }
    deallocated += StringBlock::Delete(string_block);
  }
  return deallocated;
}